

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_inet_socket_address.c
# Opt level: O1

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/tests/test_inet_socket_address.c"
            );
  UnityDefaultTestRun(test_init_inet_socket_address,"test_init_inet_socket_address",0x5f);
  UnityDefaultTestRun(test_init_inet_socket_address_no_sock_addr,
                      "test_init_inet_socket_address_no_sock_addr",0x60);
  UnityDefaultTestRun(test_init_inet_socket_address_no_inet_address,
                      "test_init_inet_socket_address_no_inet_address",0x61);
  UnityDefaultTestRun(test_init_inet_socket_address_wrong_family,
                      "test_init_inet_socket_address_wrong_family",0x62);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
	UNITY_BEGIN();
	RUN_TEST(test_init_inet_socket_address);
	RUN_TEST(test_init_inet_socket_address_no_sock_addr);
	RUN_TEST(test_init_inet_socket_address_no_inet_address);
	RUN_TEST(test_init_inet_socket_address_wrong_family);
	return UNITY_END();
}